

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Remote.cpp
# Opt level: O2

void __thiscall XPMP2::RmtDataAcAnimTy::add(RmtDataAcAnimTy *this,DR_VALS idx,float f)

{
  byte bVar1;
  uint8_t uVar2;
  ulong uVar3;
  XPMP2Error *this_00;
  
  uVar3 = (ulong)(byte)(this->super_RmtDataBaseTy).field_0xd;
  if (uVar3 < 0x2a) {
    (&(this->super_RmtDataBaseTy).field_0xf)[uVar3 * 2] = idx;
    uVar2 = RemoteDataRefPackTy::pack((RemoteDataRefPackTy *)(REMOTE_DR_DEF + (ulong)idx * 8),f);
    bVar1 = (this->super_RmtDataBaseTy).field_0xd;
    (&this->field_0x10)[(ulong)bVar1 * 2] = uVar2;
    (this->super_RmtDataBaseTy).field_0xd = bVar1 + 1;
    return;
  }
  this_00 = (XPMP2Error *)__cxa_allocate_exception(0x78);
  XPMP2Error::XPMP2Error
            (this_00,
             "/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/Remote.cpp"
             ,0x1f1,"add","ASSERT FAILED: %s","data.numVals < V_COUNT");
  __cxa_throw(this_00,&XPMP2Error::typeinfo,XPMP2Error::~XPMP2Error);
}

Assistant:

void RmtDataAcAnimTy::add (DR_VALS idx, float f)
{
    LOG_ASSERT(data.numVals < V_COUNT);
    data.v[data.numVals].idx = idx;
    data.v[data.numVals].v   = REMOTE_DR_DEF[idx].pack(f);
    ++data.numVals;
}